

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall CLI::Option::check_sname(Option *this,string *name)

{
  pointer pcVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  long *local_68;
  long local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  long *local_48;
  long local_40;
  long local_38;
  undefined8 uStack_30;
  
  if ((this->super_OptionBase<CLI::Option>).ignore_case_ == true) {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_68 = (long *)&local_58;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + name->_M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_68,(undefined1 *)(local_60 + (long)local_68),local_68);
    if (local_68 == (long *)&local_58) {
      uStack_30 = uStack_50;
      local_48 = &local_38;
    }
    else {
      local_48 = local_68;
    }
    local_38 = CONCAT71(uStack_57,local_58);
    local_40 = local_60;
    local_60 = 0;
    local_58 = 0;
    local_68 = (long *)&local_58;
    ::std::__cxx11::string::operator=((string *)name,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
    if (local_68 != (long *)&local_58) {
      operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
    }
    _Var2 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<CLI::Option::check_sname(std::__cxx11::string)const::_lambda(std::__cxx11::string)_1_>>
                      ((this->snames_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->snames_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,name);
  }
  else {
    _Var2 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((this->snames_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->snames_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,name);
  }
  return _Var2._M_current !=
         (this->snames_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool check_sname(std::string name) const {
        if(ignore_case_) {
            name = detail::to_lower(name);
            return std::find_if(std::begin(snames_), std::end(snames_), [&name](std::string local_sname) {
                       return detail::to_lower(local_sname) == name;
                   }) != std::end(snames_);
        } else
            return std::find(std::begin(snames_), std::end(snames_), name) != std::end(snames_);
    }